

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueConverter.cpp
# Opt level: O0

void helics::detail::convertFromBinary(byte *data,NamedPoint *val)

{
  byte *data_00;
  long in_RSI;
  byte *in_RDI;
  char *unaff_retaddr;
  size_t size;
  
  *(undefined8 *)(in_RSI + 0x20) = *(undefined8 *)(in_RDI + 8);
  data_00 = (byte *)getDataSize(in_RDI);
  std::__cxx11::string::assign<char_const*,void>(&val->name,(char *)size,unaff_retaddr);
  if ((*in_RDI & 1) != 0) {
    checks::swapBytes<8ul>(data_00);
  }
  return;
}

Assistant:

void convertFromBinary(const std::byte* data, NamedPoint& val)
{
    std::memcpy(&val.value, data + 8, 8);
    const std::size_t size = getDataSize(data);
    val.name.assign(reinterpret_cast<const char*>(data) + 16U,
                    reinterpret_cast<const char*>(data) + 16U + size);
    if ((data[0] & endianMask) != littleEndianCode) {
        checks::swapBytes<8>(reinterpret_cast<std::byte*>(&val.value));
    }
}